

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O0

void Marshall_object_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Am_Value *pAVar4;
  Am_Value local_98;
  Am_Slot_Key local_82;
  undefined1 local_80 [6];
  Am_Slot_Key current_slot;
  Am_Value_List slot_list;
  long local_60;
  long instance_num;
  char *in_obj_id;
  Am_String local_30;
  Am_String proto_name;
  Am_Object in_obj;
  Am_Connection *my_connection_ptr_local;
  Am_Value *in_value_local;
  int the_socket_local;
  
  Am_Object::Am_Object((Am_Object *)&proto_name,in_value);
  pcVar3 = Am_Connection::Get_Net_Proto_Name((Am_Object *)&proto_name);
  Am_String::Am_String(&local_30,pcVar3,true);
  Am_Value::Am_Value((Am_Value *)&in_obj_id,&local_30);
  Am_Connection::Send(my_connection_ptr,(Am_Value *)&in_obj_id);
  Am_Value::~Am_Value((Am_Value *)&in_obj_id);
  pcVar3 = Am_Connection::Get_Net_Object_ID((Am_Object *)&proto_name);
  if (pcVar3 == (char *)0x0) {
    iVar2 = Am_Connection::Num_Instances();
    local_60 = (long)(iVar2 + 1);
    pcVar3 = Am_String::operator_cast_to_char_(&local_30);
    Am_Connection::Set_Net_Instance((Am_Object *)&proto_name,pcVar3,iVar2 + 1);
  }
  else {
    local_60 = Am_Connection::Extract_Instance_Num(my_connection_ptr,pcVar3);
  }
  Am_Value::Am_Value((Am_Value *)&slot_list.item,local_60);
  Am_Connection::Send(my_connection_ptr,(Am_Value *)&slot_list.item);
  Am_Value::~Am_Value((Am_Value *)&slot_list.item);
  pAVar4 = Am_Object::Get((Am_Object *)&proto_name,0xb8,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_80,pAVar4);
  Am_Value_List::Start((Am_Value_List *)local_80);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_80);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar4 = Am_Value_List::Get((Am_Value_List *)local_80);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    local_82 = (Am_Slot_Key)iVar2;
    pAVar4 = Am_Object::Get((Am_Object *)&proto_name,local_82,0);
    Am_Value::Am_Value(&local_98,pAVar4);
    Am_Connection::Send(my_connection_ptr,&local_98);
    Am_Value::~Am_Value(&local_98);
    Am_Value_List::Next((Am_Value_List *)local_80);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_80);
  Am_String::~Am_String(&local_30);
  Am_Object::~Am_Object((Am_Object *)&proto_name);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_object,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)the_socket; // avoid warning
  Am_Object in_obj = in_value;
  Am_String proto_name = Am_Connection::Get_Net_Proto_Name(in_obj);
  //
  my_connection_ptr->Send(proto_name);

  //
  const char *in_obj_id = Am_Connection::Get_Net_Object_ID(in_obj);
  //
  long instance_num;
  if (in_obj_id == nullptr) // No ID assigned yet
  {
    //
    instance_num = Am_Connection::Num_Instances() + 1;
    Am_Connection::Set_Net_Instance(in_obj, proto_name, instance_num);
  } else {
    instance_num = my_connection_ptr->Extract_Instance_Num(in_obj_id);
  }
  my_connection_ptr->Send(instance_num);
  //  recv(the_socket, &net_type,sizeof(net_type),0);
  //  bool ok=Unmarshall_bool.Call(the_socket,my_connection_ptr);
  if (true) {
    Am_Value_List slot_list = in_obj.Get(Am_SLOTS_TO_SAVE);
    Am_Slot_Key current_slot;
    for (
        slot_list.Start(); !(slot_list.Last());
        slot_list
            .Next()) { /*Note: slot keys are shorts, value is char 256 will overflow!*/
      current_slot = (int)slot_list.Get();
      my_connection_ptr->Send(in_obj.Get(current_slot));
    }
  } else // Not ok
    std::cerr << " Error when sending object: " << in_obj << "!\n";
}